

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::QuadMesh,_embree::QuadMv<4>_>::RefBuilderLarge::
attachBuildRefs(RefBuilderLarge *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  atomic<int> *paVar1;
  int iVar2;
  size_t sVar3;
  BVHN<4> *pBVar4;
  Geometry *pGVar5;
  ulong uVar6;
  BuildRef *pBVar7;
  undefined1 auVar8 [16];
  Vec3fx VVar9;
  Vec3fx VVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  Geometry *pGVar14;
  PrimRef PVar15;
  float fVar16;
  
  sVar3 = this->objectID_;
  pBVar4 = (topBuilder->bvh->objects).
           super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
           super__Vector_impl_data._M_start[sVar3];
  pGVar5 = (topBuilder->scene->geometries).items[sVar3].ptr;
  if ((pGVar5 != (Geometry *)0x0) &&
     ((topBuilder->scene->geometryModCounters_).items[sVar3] < pGVar5->modCounter_)) {
    (*(((this->builder_).ptr)->super_RefCount)._vptr_RefCount[4])();
  }
  auVar12 = vminps_avx((undefined1  [16])(pBVar4->super_AccelData).bounds.bounds0.lower.field_0,
                       (undefined1  [16])(pBVar4->super_AccelData).bounds.bounds1.lower.field_0);
  auVar11 = vmaxps_avx((undefined1  [16])(pBVar4->super_AccelData).bounds.bounds0.upper.field_0,
                       (undefined1  [16])(pBVar4->super_AccelData).bounds.bounds1.upper.field_0);
  auVar8 = vcmpps_avx(auVar12,auVar11,2);
  uVar13 = vmovmskps_avx(auVar8);
  if ((~(byte)uVar13 & 7) == 0) {
    pGVar5 = (topBuilder->scene->geometries).items[this->objectID_].ptr;
    pGVar14 = (Geometry *)0x0;
    if (*(char *)&pGVar5->field_8 == '\x15') {
      pGVar14 = pGVar5;
    }
    uVar6 = (pBVar4->root).ptr;
    VVar9.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         vinsertps_avx(auVar11,ZEXT416(pGVar14->numPrimitives),0x30);
    VVar10.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         vinsertps_avx(auVar12,ZEXT416((uint)this->objectID_),0x30);
    PVar15.upper.field_0 = VVar9.field_0;
    PVar15.lower.field_0 = VVar10.field_0;
    fVar16 = 0.0;
    if ((uVar6 & 8) == 0) {
      auVar12 = vsubps_avx((undefined1  [16])VVar9.field_0,(undefined1  [16])VVar10.field_0);
      auVar8 = vmovshdup_avx(auVar12);
      auVar11 = vshufpd_avx(auVar12,auVar12,1);
      fVar16 = auVar12._0_4_ * (auVar8._0_4_ + auVar11._0_4_) + auVar8._0_4_ * auVar11._0_4_;
      fVar16 = fVar16 + fVar16;
    }
    LOCK();
    paVar1 = &topBuilder->nextRef;
    iVar2 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    pBVar7 = (topBuilder->refs).items;
    pBVar7[iVar2].super_PrimRef = PVar15;
    pBVar7[iVar2].node.ptr = uVar6;
    pBVar7[iVar2].bounds_area = fVar16;
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder)
        {
          BVH* object  = topBuilder->getBVH(objectID_); assert(object);
          
          /* build object if it got modified */
          if (topBuilder->isGeometryModified(objectID_))
            builder_->build();

          /* create build primitive */
          if (!object->getBounds().empty())
          {
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            Mesh* mesh = topBuilder->getMesh(objectID_);
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(object->getBounds(),object->root,(unsigned int)objectID_,(unsigned int)mesh->size());
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(object->getBounds(),object->root);
#endif
          }
        }